

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TCMallocTest_Versions_Test::TestBody(TCMallocTest_Versions_Test *this)

{
  ostream *poVar1;
  char *pcVar2;
  undefined1 local_1d0 [392];
  undefined1 local_48 [8];
  string expected_version_string;
  AssertionResult gtest_ar;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
  poVar1 = std::operator<<((ostream *)(local_1d0 + 0x10),"gperftools ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x10);
  std::operator<<(poVar1,".90");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d0,"gperftools 2.16.90",(allocator<char> *)&gtest_ar.message_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(expected_version_string.field_2._M_local_buf + 8),
             "expected_version_string","std::string(\"gperftools 2.16.90\")",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  if (expected_version_string.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_1d0);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x26b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)local_1d0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1d0._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    pcVar2 = getenv("GPERFTOOLS_ENSURE_PACKAGE_VERSION");
    if (pcVar2 != (char *)0x0) {
      fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
              ,0x275,"getenv(\"GPERFTOOLS_ENSURE_PACKAGE_VERSION\")","==","nullptr");
      abort();
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

TEST(TCMallocTest, Versions) {
  auto build_version_string = [] (int major, int minor, const char* patch) -> std::string {
    CHECK(patch[0] == 0 || patch[0] == '.'); // patch version needs to start with dot
    std::stringstream ss;
    ss << "gperftools " << major << "." << minor << patch;
    return ss.str();
  };

  // We make sure that TC_VERSION_STRING define matches
  // TC_VERSION_MAJOR, TC_VERSION_MAJOR and TC_VERSION_PATCH (see
  // tcmalloc.h)
  std::string expected_version_string = build_version_string(TC_VERSION_MAJOR, TC_VERSION_MINOR, TC_VERSION_PATCH);
  ASSERT_EQ(expected_version_string, std::string(TC_VERSION_STRING));

  // autoconf's config.h has PACKAGE_VERSION that is taken from configure.ac
#if defined(PACKAGE_VERSION)
  // And we make sure that autoconf's idea of version matches what
  // we've manually put into tcmalloc.h
  ASSERT_EQ(expected_version_string, std::string("gperftools ") + PACKAGE_VERSION);
#else
  // Make sure we're able to exercise line above (we set this
  // environment variable in test runner)
  CHECK_EQ(getenv("GPERFTOOLS_ENSURE_PACKAGE_VERSION"), nullptr);
#endif
}